

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O2

int lj_cf_table_insert(lua_State *L)

{
  anon_struct_8_2_fd66bcdd_for_TValue_2 aVar1;
  MSize key;
  int iVar2;
  uint key_00;
  uint uVar3;
  GCtab *t;
  TValue *pTVar4;
  ulong uVar5;
  long lVar6;
  TValue *pTVar7;
  long lVar8;
  GCobj *o;
  
  t = lj_lib_checktab(L,1);
  key = lj_tab_len(t);
  iVar2 = *(int *)&L->top - *(int *)&L->base;
  key_00 = key + 1;
  if (iVar2 != 0x10) {
    if (iVar2 != 0x18) {
      lj_err_caller(L,LJ_ERR_TABINS);
    }
    key_00 = lj_lib_checkint(L,2);
    lVar8 = (long)(int)(key + 1);
    lVar6 = lVar8 * 8;
    for (; (int)key_00 < lVar8; lVar8 = lVar8 + -1) {
      uVar3 = t->asize;
      if (key + 1 < uVar3) {
        pTVar7 = (TValue *)((ulong)(t->array).ptr32 + lVar6);
      }
      else {
        pTVar7 = lj_tab_setinth(L,t,key + 1);
        uVar3 = t->asize;
      }
      if (key < uVar3) {
        pTVar4 = (TValue *)((ulong)(t->array).ptr32 + lVar6 + -8);
      }
      else {
        pTVar4 = lj_tab_getinth(t,key);
      }
      if (pTVar4 == (TValue *)0x0) {
        (pTVar7->field_2).it = 0xffffffff;
      }
      else {
        *pTVar7 = *pTVar4;
      }
      lVar6 = lVar6 + -8;
      key = key - 1;
    }
  }
  if (key_00 < t->asize) {
    pTVar7 = (TValue *)((ulong)(t->array).ptr32 + (long)(int)key_00 * 8);
  }
  else {
    pTVar7 = lj_tab_setinth(L,t,key_00);
  }
  aVar1 = L->top[-1].field_2;
  pTVar7->field_2 = aVar1;
  if (((aVar1.it + 0xd < 9) && ((*(byte *)(((ulong)aVar1 & 0xffffffff) + 4) & 3) != 0)) &&
     ((t->marked & 4) != 0)) {
    uVar5 = (ulong)(L->glref).ptr32;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr32 = *(uint32_t *)(uVar5 + 0x3c);
    *(int *)(uVar5 + 0x3c) = (int)t;
  }
  return 0;
}

Assistant:

LJLIB_CF(table_insert)		LJLIB_REC(.)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = (int32_t)lj_tab_len(t) + 1;
  int nargs = (int)((char *)L->top - (char *)L->base);
  if (nargs != 2*sizeof(TValue)) {
    if (nargs != 3*sizeof(TValue))
      lj_err_caller(L, LJ_ERR_TABINS);
    /* NOBARRIER: This just moves existing elements around. */
    for (n = lj_lib_checkint(L, 2); i > n; i--) {
      /* The set may invalidate the get pointer, so need to do it first! */
      TValue *dst = lj_tab_setint(L, t, i);
      cTValue *src = lj_tab_getint(t, i-1);
      if (src) {
	copyTV(L, dst, src);
      } else {
	setnilV(dst);
      }
    }
    i = n;
  }
  {
    TValue *dst = lj_tab_setint(L, t, i);
    copyTV(L, dst, L->top-1);  /* Set new value. */
    lj_gc_barriert(L, t, dst);
  }
  return 0;
}